

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warrior.c
# Opt level: O0

void do_overhead(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  OBJ_DATA *pOVar4;
  char *pcVar5;
  CHAR_DATA *victim_00;
  char *in_RSI;
  CHAR_DATA *in_RDI;
  float fVar6;
  AFFECT_DATA af;
  OBJ_DATA *weapon;
  CHAR_DATA *victim;
  int dammod;
  float special;
  int skill;
  char buf [4608];
  char arg [4608];
  undefined4 in_stack_ffffffffffffdb28;
  int in_stack_ffffffffffffdb2c;
  CHAR_DATA *in_stack_ffffffffffffdb30;
  undefined4 in_stack_ffffffffffffdb38;
  int in_stack_ffffffffffffdb3c;
  CHAR_DATA *in_stack_ffffffffffffdb40;
  CHAR_DATA *in_stack_ffffffffffffdb48;
  int in_stack_ffffffffffffdb50;
  int in_stack_ffffffffffffdb54;
  CHAR_DATA *in_stack_ffffffffffffdb60;
  CHAR_DATA *local_2430;
  int in_stack_ffffffffffffdc04;
  undefined1 in_stack_ffffffffffffdc0b;
  int in_stack_ffffffffffffdc0c;
  CHAR_DATA *in_stack_ffffffffffffdc10;
  int in_stack_ffffffffffffdc2c;
  CHAR_DATA *in_stack_ffffffffffffdc30;
  int in_stack_ffffffffffffdc3c;
  undefined1 in_stack_ffffffffffffdc42;
  undefined1 in_stack_ffffffffffffdc43;
  int in_stack_ffffffffffffdc44;
  CHAR_DATA *in_stack_ffffffffffffdc48;
  CHAR_DATA *in_stack_ffffffffffffdc50;
  int in_stack_ffffffffffffdc70;
  NOTE_DATA *in_stack_ffffffffffffdc78;
  char *in_stack_ffffffffffffed30;
  CHAR_DATA *in_stack_ffffffffffffed38;
  
  one_argument((char *)in_stack_ffffffffffffdb30,
               (char *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28));
  iVar2 = get_skill(in_stack_ffffffffffffdc30,in_stack_ffffffffffffdc2c);
  if (iVar2 == 0) {
    send_to_char((char *)in_stack_ffffffffffffdb40,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38));
  }
  else {
    if (*in_RSI == '\0') {
      local_2430 = in_RDI->fighting;
      if (local_2430 == (CHAR_DATA *)0x0) {
        send_to_char((char *)in_stack_ffffffffffffdb40,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38));
        return;
      }
    }
    else {
      local_2430 = get_char_room(in_stack_ffffffffffffed38,in_stack_ffffffffffffed30);
      if (local_2430 == (CHAR_DATA *)0x0) {
        send_to_char((char *)in_stack_ffffffffffffdb40,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38));
        return;
      }
    }
    if (local_2430 == in_RDI) {
      send_to_char((char *)in_stack_ffffffffffffdb40,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38));
    }
    else {
      pOVar4 = get_eq_char(in_RDI,0x10);
      if (pOVar4 == (OBJ_DATA *)0x0) {
        send_to_char((char *)in_stack_ffffffffffffdb40,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38));
      }
      else if (pOVar4->weight < 0xf) {
        send_to_char((char *)in_stack_ffffffffffffdb40,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38));
      }
      else {
        bVar1 = is_safe(in_stack_ffffffffffffdb30,
                        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28));
        if (!bVar1) {
          if (in_RDI->size + 1 < (int)local_2430->size) {
            send_to_char((char *)in_stack_ffffffffffffdb40,
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38))
            ;
          }
          else if ((in_RDI->fighting == (CHAR_DATA *)0x0) &&
                  (bVar1 = is_affected(local_2430,(int)gsn_overhead), bVar1)) {
            send_to_char((char *)in_stack_ffffffffffffdb40,
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38))
            ;
          }
          else {
            victim_00 = (CHAR_DATA *)(ulong)(pOVar4->value[0] - 1);
            switch(victim_00) {
            case (CHAR_DATA *)0x0:
              act((char *)in_stack_ffffffffffffdb40,
                  (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                  in_stack_ffffffffffffdb30,
                  (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
              act((char *)in_stack_ffffffffffffdb40,
                  (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                  in_stack_ffffffffffffdb30,
                  (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
              act((char *)in_stack_ffffffffffffdb40,
                  (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                  in_stack_ffffffffffffdb30,
                  (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
              break;
            default:
              send_to_char((char *)in_stack_ffffffffffffdb40,
                           (CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38));
              return;
            case (CHAR_DATA *)0x3:
              act((char *)in_stack_ffffffffffffdb40,
                  (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                  in_stack_ffffffffffffdb30,
                  (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
              act((char *)in_stack_ffffffffffffdb40,
                  (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                  in_stack_ffffffffffffdb30,
                  (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
              act((char *)in_stack_ffffffffffffdb40,
                  (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                  in_stack_ffffffffffffdb30,
                  (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
              break;
            case (CHAR_DATA *)0x4:
              act((char *)in_stack_ffffffffffffdb40,
                  (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                  in_stack_ffffffffffffdb30,
                  (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
              act((char *)in_stack_ffffffffffffdb40,
                  (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                  in_stack_ffffffffffffdb30,
                  (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
              act((char *)in_stack_ffffffffffffdb40,
                  (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                  in_stack_ffffffffffffdb30,
                  (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
              break;
            case (CHAR_DATA *)0x5:
              act((char *)in_stack_ffffffffffffdb40,
                  (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                  in_stack_ffffffffffffdb30,
                  (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
              act((char *)in_stack_ffffffffffffdb40,
                  (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                  in_stack_ffffffffffffdb30,
                  (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
              act((char *)in_stack_ffffffffffffdb40,
                  (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                  in_stack_ffffffffffffdb30,
                  (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
              break;
            case (CHAR_DATA *)0x8:
              act((char *)in_stack_ffffffffffffdb40,
                  (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                  in_stack_ffffffffffffdb30,
                  (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
              act((char *)in_stack_ffffffffffffdb40,
                  (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                  in_stack_ffffffffffffdb30,
                  (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
              act((char *)in_stack_ffffffffffffdb40,
                  (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                  in_stack_ffffffffffffdb30,
                  (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
            }
            fVar6 = (float)iVar2 * ((float)((int)in_RDI->size - (int)local_2430->size) / 4.0 + 1.0)
                    * ((float)(int)pOVar4->weight / 200.0 + 1.0);
            iVar3 = number_percent();
            if ((double)iVar2 * 0.7 <= (double)iVar3) {
              damage(in_stack_ffffffffffffdb60,victim_00,in_stack_ffffffffffffdb54,
                     in_stack_ffffffffffffdb50,(int)((ulong)in_stack_ffffffffffffdb48 >> 0x20),
                     SUB81((ulong)in_stack_ffffffffffffdb48 >> 0x18,0));
              check_improve(in_stack_ffffffffffffdc10,in_stack_ffffffffffffdc0c,
                            (bool)in_stack_ffffffffffffdc0b,in_stack_ffffffffffffdc04);
            }
            else {
              if ((in_RDI->fighting == (CHAR_DATA *)0x0) &&
                 (iVar2 = number_percent(), (float)iVar2 < fVar6 * 0.3)) {
                init_affect((AFFECT_DATA *)0x71e92e);
                std::pow<int,int>(0,0x71e94b);
                in_stack_ffffffffffffdb54 = pOVar4->value[0];
                if (in_stack_ffffffffffffdb54 == 4) {
                  act((char *)in_stack_ffffffffffffdb40,
                      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                      in_stack_ffffffffffffdb30,
                      (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
                  act((char *)in_stack_ffffffffffffdb40,
                      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                      in_stack_ffffffffffffdb30,
                      (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
                  act((char *)in_stack_ffffffffffffdb40,
                      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                      in_stack_ffffffffffffdb30,
                      (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
                  affect_to_char(in_stack_ffffffffffffdb30,
                                 (AFFECT_DATA *)
                                 CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28));
                  stop_fighting(in_stack_ffffffffffffdb30,
                                SUB41((uint)in_stack_ffffffffffffdb2c >> 0x18,0));
                  local_2430->position = 4;
                  check_improve(in_stack_ffffffffffffdc10,in_stack_ffffffffffffdc0c,
                                (bool)in_stack_ffffffffffffdc0b,in_stack_ffffffffffffdc04);
                  WAIT_STATE(in_stack_ffffffffffffdb40,in_stack_ffffffffffffdb3c);
                  return;
                }
                if (in_stack_ffffffffffffdb54 == 6) {
                  act((char *)in_stack_ffffffffffffdb40,
                      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                      in_stack_ffffffffffffdb30,
                      (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
                  act((char *)in_stack_ffffffffffffdb40,
                      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                      in_stack_ffffffffffffdb30,
                      (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
                  act((char *)in_stack_ffffffffffffdb40,
                      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                      in_stack_ffffffffffffdb30,
                      (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
                  affect_to_char(in_stack_ffffffffffffdb30,
                                 (AFFECT_DATA *)
                                 CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28));
                  stop_fighting(in_stack_ffffffffffffdb30,
                                SUB41((uint)in_stack_ffffffffffffdb2c >> 0x18,0));
                  local_2430->position = 4;
                  check_improve(in_stack_ffffffffffffdc10,in_stack_ffffffffffffdc0c,
                                (bool)in_stack_ffffffffffffdc0b,in_stack_ffffffffffffdc04);
                  WAIT_STATE(in_stack_ffffffffffffdb40,in_stack_ffffffffffffdb3c);
                  return;
                }
                if (in_stack_ffffffffffffdb54 == 9) {
                  act((char *)in_stack_ffffffffffffdb40,
                      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                      in_stack_ffffffffffffdb30,
                      (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
                  act((char *)in_stack_ffffffffffffdb40,
                      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                      in_stack_ffffffffffffdb30,
                      (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
                  act((char *)in_stack_ffffffffffffdb40,
                      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                      in_stack_ffffffffffffdb30,
                      (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
                  affect_to_char(in_stack_ffffffffffffdb30,
                                 (AFFECT_DATA *)
                                 CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28));
                  stop_fighting(in_stack_ffffffffffffdb30,
                                SUB41((uint)in_stack_ffffffffffffdb2c >> 0x18,0));
                  local_2430->position = 4;
                  check_improve(in_stack_ffffffffffffdc10,in_stack_ffffffffffffdc0c,
                                (bool)in_stack_ffffffffffffdc0b,in_stack_ffffffffffffdc04);
                  WAIT_STATE(in_stack_ffffffffffffdb40,in_stack_ffffffffffffdb3c);
                  return;
                }
              }
              iVar2 = number_percent();
              if ((float)iVar2 < fVar6 * 0.5) {
                init_affect((AFFECT_DATA *)0x71eca5);
                in_stack_ffffffffffffdb48 = (CHAR_DATA *)(ulong)(pOVar4->value[0] - 1);
                switch(in_stack_ffffffffffffdb48) {
                case (CHAR_DATA *)0x0:
                  act((char *)in_stack_ffffffffffffdb40,
                      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                      in_stack_ffffffffffffdb30,
                      (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
                  act((char *)in_stack_ffffffffffffdb40,
                      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                      in_stack_ffffffffffffdb30,
                      (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
                  act((char *)in_stack_ffffffffffffdb40,
                      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                      in_stack_ffffffffffffdb30,
                      (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
                  bVar1 = is_affected(local_2430,(int)gsn_bleeding);
                  if (!bVar1) {
                    new_affect_to_char((CHAR_DATA *)
                                       CONCAT44(in_stack_ffffffffffffdb54,in_stack_ffffffffffffdb50)
                                       ,(AFFECT_DATA *)in_stack_ffffffffffffdb48);
                  }
                  break;
                case (CHAR_DATA *)0x3:
                  act((char *)in_stack_ffffffffffffdb40,
                      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                      in_stack_ffffffffffffdb30,
                      (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
                  act((char *)in_stack_ffffffffffffdb40,
                      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                      in_stack_ffffffffffffdb30,
                      (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
                  act((char *)in_stack_ffffffffffffdb40,
                      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                      in_stack_ffffffffffffdb30,
                      (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
                  LAG_CHAR(in_stack_ffffffffffffdb30,in_stack_ffffffffffffdb2c);
                  break;
                case (CHAR_DATA *)0x4:
                  act((char *)in_stack_ffffffffffffdb40,
                      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                      in_stack_ffffffffffffdb30,
                      (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
                  act((char *)in_stack_ffffffffffffdb40,
                      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                      in_stack_ffffffffffffdb30,
                      (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
                  act((char *)in_stack_ffffffffffffdb40,
                      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                      in_stack_ffffffffffffdb30,
                      (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
                  bVar1 = is_affected(local_2430,(int)gsn_bleeding);
                  if (!bVar1) {
                    new_affect_to_char((CHAR_DATA *)
                                       CONCAT44(in_stack_ffffffffffffdb54,in_stack_ffffffffffffdb50)
                                       ,(AFFECT_DATA *)in_stack_ffffffffffffdb48);
                  }
                  break;
                case (CHAR_DATA *)0x5:
                  act((char *)in_stack_ffffffffffffdb40,
                      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                      in_stack_ffffffffffffdb30,
                      (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
                  act((char *)in_stack_ffffffffffffdb40,
                      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                      in_stack_ffffffffffffdb30,
                      (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
                  act((char *)in_stack_ffffffffffffdb40,
                      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                      in_stack_ffffffffffffdb30,
                      (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
                  LAG_CHAR(in_stack_ffffffffffffdb30,in_stack_ffffffffffffdb2c);
                  break;
                case (CHAR_DATA *)0x8:
                  act((char *)in_stack_ffffffffffffdb40,
                      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                      in_stack_ffffffffffffdb30,
                      (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
                  act((char *)in_stack_ffffffffffffdb40,
                      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                      in_stack_ffffffffffffdb30,
                      (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
                  act((char *)in_stack_ffffffffffffdb40,
                      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                      in_stack_ffffffffffffdb30,
                      (void *)CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28),0);
                  LAG_CHAR(in_stack_ffffffffffffdb30,in_stack_ffffffffffffdb2c);
                }
              }
              bVar1 = is_npc((CHAR_DATA *)
                             CONCAT44(in_stack_ffffffffffffdb2c,in_stack_ffffffffffffdb28));
              if ((!bVar1) &&
                 ((in_RDI->fighting == (CHAR_DATA *)0x0 ||
                  (local_2430->fighting == (CHAR_DATA *)0x0)))) {
                bVar1 = can_see(in_stack_ffffffffffffdb48,in_stack_ffffffffffffdb40);
                if (bVar1) {
                  in_stack_ffffffffffffdb40 = (CHAR_DATA *)&stack0xffffffffffffdbe8;
                  pcVar5 = pers((CHAR_DATA *)
                                CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                                in_stack_ffffffffffffdb30);
                  sprintf((char *)in_stack_ffffffffffffdb40,"Help! %s is trying to crush my skull!",
                          pcVar5);
                  do_myell(in_stack_ffffffffffffdb40,
                           (char *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                           in_stack_ffffffffffffdb30);
                }
                else {
                  do_myell(in_stack_ffffffffffffdb40,
                           (char *)CONCAT44(in_stack_ffffffffffffdb3c,in_stack_ffffffffffffdb38),
                           in_stack_ffffffffffffdb30);
                }
              }
              one_hit_new(in_stack_ffffffffffffdc50,in_stack_ffffffffffffdc48,
                          in_stack_ffffffffffffdc44,(bool)in_stack_ffffffffffffdc43,
                          (bool)in_stack_ffffffffffffdc42,in_stack_ffffffffffffdc3c,
                          in_stack_ffffffffffffdc70,(char *)in_stack_ffffffffffffdc78);
              check_improve(in_stack_ffffffffffffdc10,in_stack_ffffffffffffdc0c,
                            (bool)in_stack_ffffffffffffdc0b,in_stack_ffffffffffffdc04);
            }
            WAIT_STATE(in_stack_ffffffffffffdb40,in_stack_ffffffffffffdb3c);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void do_overhead(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	char buf[MAX_STRING_LENGTH];
	int skill;
	float special;
	int dammod = 100;
	CHAR_DATA *victim;
	OBJ_DATA *weapon;
	AFFECT_DATA af;

	one_argument(argument, arg);

	skill = get_skill(ch, gsn_overhead);

	if (skill == 0)
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	if (argument[0] == '\0')
	{
		victim = ch->fighting;
		if (victim == nullptr)
		{
			send_to_char("Overhead who?\n\r", ch);
			return;
		}
	}
	else
	{
		victim = get_char_room(ch, argument);

		if (victim == nullptr)
		{
			send_to_char("They aren't here.\n\r", ch);
			return;
		}
	}

	if (victim == ch)
	{
		send_to_char("You aren't too bright, are you?\n\r", ch);
		return;
	}

	weapon = get_eq_char(ch, WEAR_WIELD);

	if (!weapon)
	{
		send_to_char("You need to be wielding a weapon for that maneuver!\n\r", ch);
		return;
	}
	
	if (weapon->weight < 15)
	{
		send_to_char("Your weapon is too light for you to execute that maneuver.\n\r", ch);
		return;
	}

	if (is_safe(ch, victim))
		return;

	if (victim->size > ch->size + 1)
	{
		send_to_char("They are too large for you to properly perform an overhead strike.\n\r", ch);
		return;
	}

	if (ch->fighting == nullptr && is_affected(victim, gsn_overhead))
	{
		send_to_char("They are guarding their head too well right now.\n\r", ch);
		return;
	}

	switch (weapon->value[0])
	{
		case WEAPON_MACE:
			act("You swing your mace overhead and bring it down toward $N with terrible force!", ch, 0, victim, TO_CHAR);
			act("$n swings $s mace overhead and brings it down toward you with terrible force!", ch, 0, victim, TO_VICT);
			act("$n swings $s mace overhead and brings it down toward $N with terrible force!", ch, 0, victim, TO_NOTVICT);
			break;
		case WEAPON_STAFF:
			act("You let loose a vicious longarm strike, your staff arcing toward $N's head!", ch, 0, victim, TO_CHAR);
			act("$n lets loose a vicious longarm strike, $s staff arcing toward your head!", ch, 0, victim, TO_VICT);
			act("$n lets loose a vicious longarm strike, $s staff arcing towards $N's head!", ch, 0, victim, TO_NOTVICT);
			break;
		case WEAPON_FLAIL:
			act("The head of your flail whistles through the air, arcing towards $N's head!", ch, 0, victim, TO_CHAR);
			act("The head of $n's flail whistles through the air, arcing towards your head!", ch, 0, victim, TO_VICT);
			act("The head of $n's flail whistles through the air, arcing towards $N's head!", ch, 0, victim, TO_NOTVICT);
			break;
		case WEAPON_AXE:
			act("With a surge of brute force, you bring your axe arcing down towards $N's head!", ch, 0, victim, TO_CHAR);
			act("With a surge of brute force, $n brings $s axe arcing down towards your head!", ch, 0, victim, TO_VICT);
			act("With a surge of brute force, $n brings $s axe arcing down towards $N's head!", ch, 0, victim, TO_NOTVICT);
			break;
		case WEAPON_SWORD:
			act("You raise your sword and attempt a vicious overhead slice at $N!", ch, 0, victim, TO_CHAR);
			act("$n raises $s sword and attempts a vicious overhead slice at you!", ch, 0, victim, TO_VICT);
			act("$n raises $s sword and attempts a vicious overhead slice at $N!", ch, 0, victim, TO_NOTVICT);
			break;
		default:
			send_to_char("You cannot perform an overhead strike with that weapon.\n\r", ch);
			return;
	}

	special = (float)(skill * (1.00f + (ch->size - victim->size) / 4.00f) * (1.00f + weapon->weight / 200.00f));

	if (number_percent() < .7 * skill)
	{
		if (ch->fighting == nullptr)
		{
			if (number_percent() < .3 * special)
			{
				init_affect(&af);
				af.where = TO_AFFECTS;
				af.duration = 2;

				SET_BIT(af.bitvector, AFF_SLEEP);

				af.type = gsn_overhead;
				af.level = ch->level;
				af.aftype = AFT_MALADY;
				af.location = 0;
				af.modifier = 0;
				af.mod_name = MOD_CONC;

				switch (weapon->value[0])
				{
					case WEAPON_MACE:
						act("$N collapses in a heap as your mace comes down solidly on top of $S head!", ch, 0, victim, TO_CHAR);
						act("The world goes black as $n's mace crashes into your head.", ch, 0, victim, TO_VICT);
						act("$N collapses in a heap as the mace comes down solidly on top of $S head!", ch, 0, victim, TO_NOTVICT);

						affect_to_char(victim, &af);
						stop_fighting(victim, true);

						victim->position = POS_SLEEPING;

						check_improve(ch, gsn_overhead, true, 1);
						WAIT_STATE(ch, 2 * PULSE_VIOLENCE);
						return;
					case WEAPON_STAFF:
						act("$N collapses in a heap as your staff comes down solidly on top of $S head!", ch, 0, victim, TO_CHAR);
						act("The world goes black as $n's staff crashes into your head.", ch, 0, victim, TO_VICT);
						act("$N collapses in a heap as the staff comes down solidly on top of $S head!", ch, 0, victim, TO_NOTVICT);

						affect_to_char(victim, &af);
						stop_fighting(victim, true);

						victim->position = POS_SLEEPING;

						check_improve(ch, gsn_overhead, true, 1);
						WAIT_STATE(ch, 2 * PULSE_VIOLENCE);
						return;
					case WEAPON_FLAIL:
						act("$N collapses in a heap as your flail comes down solidly on top of $S head!", ch, 0, victim, TO_CHAR);
						act("The world goes black as $n's flail crashes into your head.", ch, 0, victim, TO_VICT);
						act("$N collapses in a heap as the flail comes down solidly on top of $S head!", ch, 0, victim, TO_NOTVICT);

						affect_to_char(victim, &af);
						stop_fighting(victim, true);

						victim->position = POS_SLEEPING;

						check_improve(ch, gsn_overhead, true, 1);
						WAIT_STATE(ch, 2 * PULSE_VIOLENCE);
						return;
				}
			}
		}

		if (number_percent() < .5 * special)
		{
			init_affect(&af);
			af.where = TO_AFFECTS;
			af.type = gsn_bleeding;
			af.location = APPLY_NONE;
			af.modifier = 0;
			af.aftype = AFT_INVIS;
			af.tick_fun = bleeding_tick;
			af.end_fun = nullptr;
			af.owner = ch;
			af.level = ch->level;

			switch (weapon->value[0])
			{
				case WEAPON_MACE:
					act("$N staggers and looks stunned as your mace crashes into $S head!", ch, 0, victim, TO_CHAR);
					act("You stagger in a daze as $n's mace crashes into your head!", ch, 0, victim, TO_VICT);
					act("$N staggers and looks stunned as the mace crashes into $S head!", ch, 0, victim, TO_NOTVICT);

					LAG_CHAR(victim, 2 * PULSE_VIOLENCE);
					dammod = 150;
					break;
				case WEAPON_STAFF:
					act("$N staggers and looks stunned as your staff crashes into $S head!", ch, 0, victim, TO_CHAR);
					act("You stagger in a daze as $n's staff crashes into your head!", ch, 0, victim, TO_VICT);
					act("$N staggers and looks stunned as the staff crashes into $S head!", ch, 0, victim, TO_NOTVICT);

					LAG_CHAR(victim, 2 * PULSE_VIOLENCE);
					dammod = 150;
					break;
				case WEAPON_FLAIL:
					act("$N staggers and looks stunned as your flail crashes into $S head!", ch, 0, victim, TO_CHAR);
					act("You stagger in a daze as $n's flail crashes into your head!", ch, 0, victim, TO_VICT);
					act("$N staggers and looks stunned as the flail crashes into $S head!", ch, 0, victim, TO_NOTVICT);

					LAG_CHAR(victim, 2 * PULSE_VIOLENCE);
					dammod = 150;
					break;
				case WEAPON_AXE:
					act("$N is enshrouded in a fine mist of blood as your mighty blow strikes true!", ch, 0, victim, TO_CHAR);
					act("You are enshrouded in a fine mist of blood as $n's axe strikes true!", ch, 0, victim, TO_VICT);
					act("$N is enshrouded in a fine mist of blood as the mighty blow strikes true!", ch, 0, victim, TO_NOTVICT);

					af.duration = ch->level / 8;

					/* fixed by cal 05/01/02 */
					if (!is_affected(victim, gsn_bleeding))
						new_affect_to_char(victim, &af);

					break;
				case WEAPON_SWORD:
					act("Your massive blade cleaves deeply into $N's flesh, striking bone!", ch, 0, victim, TO_CHAR);
					act("$n's massive blade cleaves deeply into your flesh, striking bone!", ch, 0, victim, TO_VICT);
					act("The massive blade cleaves deeply into $N's flesh, striking bone!", ch, 0, victim, TO_NOTVICT);

					dammod = 200;
					af.duration = ch->level / 12;

					if (!is_affected(victim, gsn_bleeding))
						new_affect_to_char(victim, &af);

					break;
			}
		}

		if (!is_npc(victim) && (ch->fighting == nullptr || victim->fighting == nullptr))
		{
			if (!can_see(victim, ch))
			{
				do_myell(victim, "Help! Someone is trying to crush my skull!", ch);
			}
			else
			{
				sprintf(buf, "Help! %s is trying to crush my skull!", pers(ch, victim));
				do_myell(victim, buf, ch);
			}
		}

		one_hit_new(ch, victim, gsn_overhead, HIT_SPECIALS, HIT_UNBLOCKABLE, HIT_NOADD, dammod, nullptr);
		check_improve(ch, gsn_overhead, true, 1);
	}
	else
	{
		damage(ch, victim, 0, gsn_overhead, DAM_NONE, true);
		check_improve(ch, gsn_overhead, false, 1);
	}

	WAIT_STATE(ch, PULSE_VIOLENCE * 2);
}